

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

string * __thiscall AmpIO::ExplainSiFault_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this)

{
  uint uVar1;
  char cVar2;
  uint32_t uVar3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  uVar3 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar3 != 0x64524131) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Not a Si controller","");
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar1 = this->ReadBuffer[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Explaining faults in the Si controller:",0x27);
  cVar2 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"1. Interlocks that are preventing the axis from turning on:",0x3b
            );
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if ((uVar1 & 1) == 0) {
    lVar6 = 0x3e;
    pcVar7 = "ESPM->dVRK communication failed. Robot not programmed? Cables?";
  }
  else {
    if ((uVar1 & 2) != 0) goto LAB_0010f1e7;
    lVar6 = 0x44;
    pcVar7 = "ESII/CC->ESPM communication failed. The problem is inside the robot.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar6);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
LAB_0010f1e7:
  if ((uVar1 & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Encoder preload is out of sync. You must preload encoder at least once.",0x47);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  uVar1 = this->ReadBuffer[1];
  BoardIO::GetHardwareVersion((BoardIO *)this);
  if ((uVar1 >> 0x13 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"48V bad. E-stop pressed?",0x18);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  if ((*(byte *)((long)this->ReadBuffer + 6) & 0x80) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Watchdog timeout.",0x11);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(end)",5);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"2. Amps that are in fault state:",0x20);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if (this->NumMotors != 0) {
    uVar8 = 0;
    do {
      uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
      uVar9 = 0;
      if (7 < uVar3) {
        uVar9 = (ulong)(*(ushort *)
                         ((long)this->ReadBuffer +
                         (ulong)(this->MOTOR_STATUS_OFFSET + (int)uVar8) * 4 + 2) & 0xf);
      }
      if ((int)uVar9 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Amp ",4);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
        pcVar7 = *(char **)(&DAT_001275b0 + uVar9 * 8);
        sVar5 = strlen(pcVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->NumMotors);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(end)",5);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string AmpIO::ExplainSiFault() const
{
    if (GetHardwareVersion() != dRA1_String) {
        return "Not a Si controller";
    }
    std::stringstream ss;
    const char* amp_fault_text[16] = {"-", "ADC saturated", "Current deviation", "HW overcurrent", "HW overtemp", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined", "Undefined"};
    uint32_t status = GetStatus();
    ss << "Explaining faults in the Si controller:" << std::endl;
    ss << std::endl;
    ss << "1. Interlocks that are preventing the axis from turning on:" << std::endl;
    if (!(status & (1 << 0))) ss << "ESPM->dVRK communication failed. Robot not programmed? Cables?" << std::endl;
    if ((status & (1 << 0)) && !(status & (1 << 1))) ss << "ESII/CC->ESPM communication failed. The problem is inside the robot." << std::endl;
    if (!(status & (1 << 3))) ss << "Encoder preload is out of sync. You must preload encoder at least once." << std::endl;
    if (!GetPowerStatus()) ss << "48V bad. E-stop pressed?" << std::endl;
    if (GetWatchdogTimeoutStatus()) ss << "Watchdog timeout." << std::endl;
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << "2. Amps that are in fault state:" << std::endl;
    for (unsigned int i = 0; i < NumMotors; i++) {
        // std::cout << NumMotors << std::endl;
        uint32_t amp_fault = GetAmpFaultCode(i);
        // std::cout << amp_fault << std::endl;
        if (amp_fault) {
            ss << "Amp " << i << ": " << amp_fault_text[amp_fault] << std::endl;
        }
    }
    ss << "(end)" << std::endl;
    ss << std::endl;
    ss << std::endl;
    return ss.str();
}